

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench.cc
# Opt level: O0

void time_map_fetch_sequential<EasyUseMap<HashObject<4,4>,int>>(int iters)

{
  reference pvVar1;
  int in_EDI;
  int i;
  char *in_stack_00000030;
  vector<int,_std::allocator<int>_> v;
  allocator_type *__a;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar2;
  int iVar3;
  undefined4 in_stack_ffffffffffffffcc;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffffd0;
  allocator_type local_21;
  vector<int,_std::allocator<int>_> local_20;
  int local_4;
  
  __a = &local_21;
  local_4 = in_EDI;
  std::allocator<int>::allocator((allocator<int> *)0x1d6151);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffffd0,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
             ,__a);
  std::allocator<int>::~allocator((allocator<int> *)0x1d6171);
  iVar2 = 0;
  while (iVar2 < local_4) {
    iVar3 = iVar2;
    pvVar1 = std::vector<int,_std::allocator<int>_>::operator[](&local_20,(long)iVar2);
    *pvVar1 = iVar2;
    iVar2 = iVar3 + 1;
  }
  time_map_fetch<EasyUseMap<HashObject<4,4>,int>>
            (v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish._4_4_,
             (vector<int,_std::allocator<int>_> *)
             v.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,in_stack_00000030);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)__a);
  return;
}

Assistant:

static void time_map_fetch_sequential(int iters) {
  vector<int> v(iters);
  for (int i = 0; i < iters; i++) {
    v[i] = i;
  }
  time_map_fetch<MapType>(iters, v, "map_fetch_sequential");
}